

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O2

bool __thiscall AInventory::CanPickup(AInventory *this,AActor *toucher)

{
  bool bVar1;
  PClass *pPVar2;
  uint i;
  ulong uVar3;
  bool bVar4;
  
  if (toucher == (AActor *)0x0) {
    bVar4 = false;
  }
  else {
    pPVar2 = DObject::GetClass((DObject *)this);
    if (*(int *)((long)&pPVar2[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                        super_DObject.GCNext + 4) == 0) {
      uVar3 = 0;
      do {
        bVar4 = *(uint *)&pPVar2[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                          field_0x2c <= uVar3;
        if (bVar4) {
          return bVar4;
        }
        bVar1 = DObject::IsKindOf((DObject *)toucher,
                                  *(PClass **)
                                   (*(long *)&pPVar2[2].super_PStruct.super_PNamedType.
                                              super_PCompoundType.super_PType.super_DObject.
                                              ObjectFlags + uVar3 * 8));
        uVar3 = uVar3 + 1;
      } while (!bVar1);
    }
    else {
      uVar3 = 0;
      do {
        bVar4 = uVar3 < *(uint *)((long)&pPVar2[2].super_PStruct.super_PNamedType.
                                         super_PCompoundType.super_PType.super_DObject.GCNext + 4);
        if (!bVar4) {
          return bVar4;
        }
        bVar1 = DObject::IsKindOf((DObject *)toucher,
                                  (PClass *)
                                  (&(pPVar2[2].super_PStruct.super_PNamedType.super_PCompoundType.
                                     super_PType.super_DObject.ObjNext)->_vptr_DObject)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (!bVar1);
    }
  }
  return bVar4;
}

Assistant:

bool AInventory::CanPickup (AActor *toucher)
{
	if (!toucher)
		return false;

	PClassInventory *ai = GetClass();
	// Is the item restricted to certain player classes?
	if (ai->RestrictedToPlayerClass.Size() != 0)
	{
		for (unsigned i = 0; i < ai->RestrictedToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->RestrictedToPlayerClass[i]))
				return true;
		}
		return false;
	}
	// Or is it forbidden to certain other classes?
	else
	{
		for (unsigned i = 0; i < ai->ForbiddenToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->ForbiddenToPlayerClass[i]))
				return false;
		}
	}
	return true;
}